

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::subscribeEvent(MlmWrap *this,string *origin,string *event)

{
  int iVar1;
  char *in_RDX;
  string evt;
  char *in_stack_00000070;
  char *in_stack_00000078;
  MlmWrap *in_stack_00000080;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::operator+(in_RDX,in_stack_ffffffffffffffe0);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  iVar1 = subscribeStream(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  std::__cxx11::string::~string(local_38);
  return iVar1;
}

Assistant:

int MlmWrap::subscribeEvent(const std::string &origin, const std::string &event){
    std::string evt = eventprefix + event;
    return subscribeStream(origin.c_str(), evt.c_str());
}